

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderTCTEgl_in::TessellationShaderTCTEgl_in
          (TessellationShaderTCTEgl_in *this,Context *context,ExtParameters *extParams)

{
  TestCaseBase::TestCaseBase
            (&this->super_TestCaseBase,context,extParams,"gl_in",
             "Verifies values of gl_in[] in a tessellation evaluation shader are taken from output variables of a tessellation control shaderif one is present."
            );
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCaseBase_02159b98;
  this->m_bo_id = 0;
  this->m_fs_id = 0;
  this->m_po_id = 0;
  this->m_tcs_id = 0;
  this->m_tcs_id = 0;
  this->m_tes_id = 0;
  this->m_vao_id = 0;
  this->m_vs_id = 0;
  return;
}

Assistant:

TessellationShaderTCTEgl_in::TessellationShaderTCTEgl_in(Context& context, const ExtParameters& extParams)
	: TestCaseBase(context, extParams, "gl_in", "Verifies values of gl_in[] in a tessellation evaluation shader "
												"are taken from output variables of a tessellation control shader"
												"if one is present.")
	, m_bo_id(0)
	, m_fs_id(0)
	, m_po_id(0)
	, m_tcs_id(0)
	, m_tes_id(0)
	, m_vao_id(0)
	, m_vs_id(0)
{
	/* Left blank on purpose */
}